

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O2

void gdImageCharUp(gdImagePtr im,gdFontPtr f,int x,int y,int c,int color)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int y_00;
  
  iVar1 = f->offset;
  if ((iVar1 <= c) && (c < iVar1 + f->nchars)) {
    iVar3 = f->w;
    iVar2 = f->h;
    iVar4 = iVar2 * iVar3;
    iVar5 = 0;
    y_00 = y;
    while (y - iVar3 < y_00) {
      for (iVar3 = 0; x + iVar3 < iVar2 + x; iVar3 = iVar3 + 1) {
        if (f->data[f->w * iVar3 + iVar5 + iVar4 * (c - iVar1)] != '\0') {
          gdImageSetPixel(im,x + iVar3,y_00,color);
          iVar2 = f->h;
        }
      }
      iVar5 = iVar5 + 1;
      y_00 = y_00 + -1;
      iVar3 = f->w;
    }
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageCharUp (gdImagePtr im, gdFontPtr f, int x, int y, int c, int color)
{
	int cx, cy;
	int px, py;
	int fline;
	cx = 0;
	cy = 0;
#ifdef CHARSET_EBCDIC
	c = ASC (c);
#endif /*CHARSET_EBCDIC */
	if ((c < f->offset) || (c >= (f->offset + f->nchars))) {
		return;
	}
	fline = (c - f->offset) * f->h * f->w;
	for (py = y; (py > (y - f->w)); py--) {
		for (px = x; (px < (x + f->h)); px++) {
			if (f->data[fline + cy * f->w + cx]) {
				gdImageSetPixel (im, px, py, color);
			}
			cy++;
		}
		cy = 0;
		cx++;
	}
}